

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

TypeMetaFunction * __thiscall
soul::PoolAllocator::
allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
          (PoolAllocator *this,Context *args,Expression *args_1,Op *args_2)

{
  Op OVar1;
  SourceCodeText *pSVar2;
  Scope *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x40);
  OVar1 = *args_2;
  *(undefined4 *)&pPVar4->field_0x18 = 0x14;
  pSVar2 = (args->location).sourceCode.object;
  pPVar4[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pSVar3 = args->parentScope;
  pPVar4[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar4[1].item = pSVar3;
  *(uint *)&pPVar4[1].field_0x18 = (uint)(OVar1 - sourceType < 6);
  pPVar4->item = &PTR__TypeMetaFunction_002cb8e0;
  pPVar4[2].size = (size_t)args_1;
  *(Op *)&pPVar4[2].destructor = OVar1;
  pPVar4->destructor =
       allocate<soul::AST::TypeMetaFunction,_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::TypeMetaFunction::Op_&>
       ::anon_class_1_0_00000001::__invoke;
  return (TypeMetaFunction *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }